

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O3

void Pdr_ManCollectValues(Pdr_Man_t *p,int k,Vec_Int_t *vObjIds,Vec_Int_t *vValues)

{
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  Aig_Obj_t *pObj;
  long lVar4;
  
  vValues->nSize = 0;
  if (-1 < k) {
    if (k < p->vSolvers->nSize) {
      if (0 < vObjIds->nSize) {
        piVar1 = (int *)p->vSolvers->pArray[(uint)k];
        lVar4 = 0;
        do {
          pVVar2 = p->pAig->vObjs;
          if (pVVar2 == (Vec_Ptr_t *)0x0) {
            pObj = (Aig_Obj_t *)0x0;
          }
          else {
            uVar3 = vObjIds->pArray[lVar4];
            if (((int)uVar3 < 0) || (pVVar2->nSize <= (int)uVar3)) goto LAB_005f6149;
            pObj = (Aig_Obj_t *)pVVar2->pArray[uVar3];
          }
          uVar3 = Pdr_ObjSatVar(p,k,3,pObj);
          if ((int)uVar3 < 0) {
            __assert_fail("iVar >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrSat.c"
                          ,0xf5,
                          "void Pdr_ManCollectValues(Pdr_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
          }
          if (*piVar1 <= (int)uVar3) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          Vec_IntPush(vValues,(uint)(*(int *)(*(long *)(piVar1 + 0x52) + (ulong)uVar3 * 4) == 1));
          lVar4 = lVar4 + 1;
        } while (lVar4 < vObjIds->nSize);
      }
      return;
    }
  }
LAB_005f6149:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Pdr_ManCollectValues( Pdr_Man_t * p, int k, Vec_Int_t * vObjIds, Vec_Int_t * vValues )
{
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int iVar, i;
    Vec_IntClear( vValues );
    pSat = Pdr_ManSolver(p, k);
    Aig_ManForEachObjVec( vObjIds, p->pAig, pObj, i )
    {
        iVar = Pdr_ObjSatVar( p, k, 3, pObj ); assert( iVar >= 0 );
        Vec_IntPush( vValues, sat_solver_var_value(pSat, iVar) );
    }
}